

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O3

uint32_t FACTCue_Pause(FACTCue *pCue,int32_t fPause)

{
  FACTWave *pWave;
  uint32_t uVar1;
  FACTSoundInstance *pFVar2;
  FACTSound *pFVar3;
  long lVar4;
  ulong uVar5;
  
  if (pCue == (FACTCue *)0x0) {
    return 1;
  }
  FAudio_PlatformLockMutex(pCue->parentBank->parentEngine->apiLock);
  if ((pCue->state & 0x30) == 0) {
    uVar1 = FAudio_timems();
    pCue->elapsed = pCue->elapsed + (uVar1 - pCue->start);
    pCue->state = (uint)(fPause != 0) << 6 | pCue->state & 0xffffffbf;
    if (pCue->simpleWave == (FACTWave *)0x0) {
      pFVar2 = pCue->playingSound;
      if ((pFVar2 != (FACTSoundInstance *)0x0) &&
         (pFVar3 = pFVar2->sound, pFVar3->trackCount != '\0')) {
        lVar4 = 0x28;
        uVar5 = 0;
        do {
          pWave = *(FACTWave **)((long)&pFVar2->tracks->events + lVar4);
          if (pWave != (FACTWave *)0x0) {
            FACTWave_Pause(pWave,fPause);
            pFVar2 = pCue->playingSound;
            pFVar3 = pFVar2->sound;
          }
          uVar5 = uVar5 + 1;
          lVar4 = lVar4 + 0x68;
        } while (uVar5 < pFVar3->trackCount);
      }
    }
    else {
      FACTWave_Pause(pCue->simpleWave,fPause);
    }
  }
  FAudio_PlatformUnlockMutex(pCue->parentBank->parentEngine->apiLock);
  return 0;
}

Assistant:

uint32_t FACTCue_Pause(FACTCue *pCue, int32_t fPause)
{
	uint8_t i;
	if (pCue == NULL)
	{
		return 1;
	}

	FAudio_PlatformLockMutex(pCue->parentBank->parentEngine->apiLock);

	/* "A stopping or stopped cue cannot be paused." */
	if (pCue->state & (FACT_STATE_STOPPING | FACT_STATE_STOPPED))
	{
		FAudio_PlatformUnlockMutex(
			pCue->parentBank->parentEngine->apiLock
		);
		return 0;
	}

	/* Store elapsed time */
	pCue->elapsed += FAudio_timems() - pCue->start;

	/* All we do is set the flag, not much to see here */
	if (fPause)
	{
		pCue->state |= FACT_STATE_PAUSED;
	}
	else
	{
		pCue->state &= ~FACT_STATE_PAUSED;
	}

	/* Pause the Waves */
	if (pCue->simpleWave != NULL)
	{
		FACTWave_Pause(pCue->simpleWave, fPause);
	}
	else if (pCue->playingSound != NULL)
	{
		for (i = 0; i < pCue->playingSound->sound->trackCount; i += 1)
		{
			if (pCue->playingSound->tracks[i].activeWave.wave != NULL)
			{
				FACTWave_Pause(
					pCue->playingSound->tracks[i].activeWave.wave,
					fPause
				);
			}
		}
	}

	FAudio_PlatformUnlockMutex(pCue->parentBank->parentEngine->apiLock);
	return 0;
}